

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.cpp
# Opt level: O1

AggregateFunction * duckdb::CountFunctionBase::GetFunction(void)

{
  AggregateFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_59;
  LogicalType local_58;
  LogicalType local_40;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_28;
  
  LogicalType::LogicalType(&local_40,ANY);
  __l._M_len = 1;
  __l._M_array = &local_40;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_28,__l,&local_59);
  LogicalType::LogicalType(&local_58,BIGINT);
  AggregateFunction::AggregateFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_28,&local_58,
             AggregateFunction::StateSize<long>,
             AggregateFunction::
             StateInitialize<long,duckdb::CountFunction,(duckdb::AggregateDestructorType)0>,
             CountFunction::CountScatter,AggregateFunction::StateCombine<long,duckdb::CountFunction>
             ,AggregateFunction::StateFinalize<long,long,duckdb::CountFunction>,SPECIAL_HANDLING,
             CountFunction::CountUpdate,(bind_aggregate_function_t)0x0,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_28);
  LogicalType::~LogicalType(&local_40);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,0,
             (char *)(in_RDI->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                     _M_string_length,0x1e561fe);
  in_RDI->order_dependent = NOT_ORDER_DEPENDENT;
  return in_RDI;
}

Assistant:

AggregateFunction CountFunctionBase::GetFunction() {
	AggregateFunction fun({LogicalType(LogicalTypeId::ANY)}, LogicalType::BIGINT, AggregateFunction::StateSize<int64_t>,
	                      AggregateFunction::StateInitialize<int64_t, CountFunction>, CountFunction::CountScatter,
	                      AggregateFunction::StateCombine<int64_t, CountFunction>,
	                      AggregateFunction::StateFinalize<int64_t, int64_t, CountFunction>,
	                      FunctionNullHandling::SPECIAL_HANDLING, CountFunction::CountUpdate);
	fun.name = "count";
	fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	return fun;
}